

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_dump_particles(mcpl_file_t f,uint64_t nskip,uint64_t nlimit,
                        _func_int_mcpl_particle_t_ptr *filter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mcpl_particle_t *pmVar4;
  long lVar5;
  uint64_t uVar6;
  code *in_RCX;
  long lVar7;
  long in_RDX;
  mcpl_file_t in_RDI;
  double dVar8;
  uint64_t idx;
  mcpl_particle_t *p;
  uint64_t count;
  double uweight;
  int has_pol;
  int has_uf;
  uint64_t in_stack_ffffffffffffffc0;
  mcpl_file_t in_stack_ffffffffffffffc8;
  
  iVar1 = mcpl_hdr_has_userflags(in_RDI);
  iVar2 = mcpl_hdr_has_polarisation(in_RDI);
  dVar8 = mcpl_hdr_universal_weight(in_RDI);
  printf(
        "index     pdgcode   ekin[MeV]       x[cm]       y[cm]       z[cm]          ux          uy          uz    time[ms]"
        );
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    printf("      weight");
  }
  if (iVar2 != 0) {
    printf("       pol-x       pol-y       pol-z");
  }
  if (iVar1 != 0) {
    printf("  userflags");
  }
  printf("\n");
  mcpl_skipforward(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  lVar5 = in_RDX;
  while( true ) {
    lVar7 = lVar5;
    if (in_RDX != 0) {
      lVar7 = lVar5 + -1;
    }
    if ((in_RDX != 0 && lVar5 == 0) ||
       (pmVar4 = mcpl_read(in_RDI), pmVar4 == (mcpl_particle_t *)0x0)) break;
    lVar5 = lVar7;
    if ((in_RCX == (code *)0x0) || (iVar3 = (*in_RCX)(pmVar4), lVar5 = lVar7, iVar3 != 0)) {
      uVar6 = mcpl_currentposition(in_RDI);
      printf("%5lu %11i %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g",pmVar4->ekin,
             pmVar4->position[0],pmVar4->position[1],pmVar4->position[2],pmVar4->direction[0],
             pmVar4->direction[1],pmVar4->direction[2],pmVar4->time,uVar6 - 1,
             (ulong)(uint)pmVar4->pdgcode);
      if ((dVar8 == 0.0) && (!NAN(dVar8))) {
        printf(" %11.5g",pmVar4->weight);
      }
      if (iVar2 != 0) {
        printf(" %11.5g %11.5g %11.5g",pmVar4->polarisation[0],pmVar4->polarisation[1],
               pmVar4->polarisation[2]);
      }
      if (iVar1 != 0) {
        printf(" 0x%08x",(ulong)pmVar4->userflags);
      }
      printf("\n");
    }
    else {
      lVar5 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void mcpl_dump_particles(mcpl_file_t f, uint64_t nskip, uint64_t nlimit,
                         int(filter)(const mcpl_particle_t*))
{
  int has_uf = mcpl_hdr_has_userflags(f);
  int has_pol = mcpl_hdr_has_polarisation(f);
  double uweight = mcpl_hdr_universal_weight(f);
  printf("index     pdgcode   ekin[MeV]       x[cm]       y[cm]       z[cm]          ux          uy          uz    time[ms]");
  if (!uweight)
    printf("      weight");
  if (has_pol)
    printf("       pol-x       pol-y       pol-z");
  if (has_uf)
    printf("  userflags");
  printf("\n");
  mcpl_skipforward(f,nskip);
  //Writing the next loop in an annoying way to silence MSVC C4706 warning:
  for ( uint64_t count = nlimit ; ( nlimit==0 || count-- ) ; ) {
    const mcpl_particle_t* p = mcpl_read(f);
    if (!p)
      break;
    if (filter && !filter(p) ) {
      ++count;
      continue;
    }
    uint64_t idx = mcpl_currentposition(f)-1;//-1 since mcpl_read skipped ahead
    printf( "%5" PRIu64
            " %11i %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g",
            idx, p->pdgcode, p->ekin,
            p->position[0], p->position[1], p->position[2],
            p->direction[0], p->direction[1], p->direction[2],
            p->time );
    if (!uweight)
      printf(" %11.5g",p->weight);
    if (has_pol)
      printf(" %11.5g %11.5g %11.5g",p->polarisation[0],p->polarisation[1],p->polarisation[2]);
    if (has_uf)
      printf(" 0x%08x",p->userflags);
    printf("\n");
  }
}